

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O0

void __thiscall xe::ri::KernelSource::~KernelSource(KernelSource *this)

{
  KernelSource *this_local;
  
  ~KernelSource(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~KernelSource	(void) {}